

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_GLSL_SINCOS(Context *ctx)

{
  int iVar1;
  int iVar2;
  char local_d8 [8];
  char code [128];
  char src0 [64];
  int mask;
  Context *ctx_local;
  
  iVar2 = (ctx->dest_arg).writemask;
  make_GLSL_srcarg_string_scalar(ctx,0,code + 0x78,0x40);
  memset(local_d8,0,0x80);
  iVar1 = writemask_x(iVar2);
  if (iVar1 == 0) {
    iVar1 = writemask_y(iVar2);
    if (iVar1 == 0) {
      iVar2 = writemask_xy(iVar2);
      if (iVar2 != 0) {
        make_GLSL_destarg_assign(ctx,local_d8,0x80,"vec2(cos(%s), sin(%s))",code + 0x78,code + 0x78)
        ;
      }
    }
    else {
      make_GLSL_destarg_assign(ctx,local_d8,0x80,"sin(%s)",code + 0x78);
    }
  }
  else {
    make_GLSL_destarg_assign(ctx,local_d8,0x80,"cos(%s)",code + 0x78);
  }
  output_line(ctx,"%s",local_d8);
  return;
}

Assistant:

static void emit_GLSL_SINCOS(Context *ctx)
{
    // we don't care about the temp registers that <= sm2 demands; ignore them.
    //  sm2 also talks about what components are left untouched vs. undefined,
    //  but we just leave those all untouched with GLSL write masks (which
    //  would fulfill the "undefined" requirement, too).
    const int mask = ctx->dest_arg.writemask;
    char src0[64]; make_GLSL_srcarg_string_scalar(ctx, 0, src0, sizeof (src0));
    char code[128] = { '\0' };

    if (writemask_x(mask))
        make_GLSL_destarg_assign(ctx, code, sizeof (code), "cos(%s)", src0);
    else if (writemask_y(mask))
        make_GLSL_destarg_assign(ctx, code, sizeof (code), "sin(%s)", src0);
    else if (writemask_xy(mask))
    {
        make_GLSL_destarg_assign(ctx, code, sizeof (code),
                                 "vec2(cos(%s), sin(%s))", src0, src0);
    } // else if

    output_line(ctx, "%s", code);
}